

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 202_happyNum.cpp
# Opt level: O3

int sqsum(int n)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = 0;
  if (n != 0) {
    do {
      iVar1 = (int)((double)iVar1 + (double)(n % 10) * (double)(n % 10));
      uVar2 = n + 9;
      n = n / 10;
    } while (0x12 < uVar2);
  }
  return iVar1;
}

Assistant:

int sqsum(int n)
{
    int s = 0;
    while (n)
    {
        s += pow(n%10,2);
        n/=10;
    }
    return s;
}